

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O1

void fmt::v5::internal::format_value<char,Date>(basic_buffer<char> *buffer,Date *value)

{
  long lVar1;
  ulong uVar2;
  ostream *poVar3;
  formatbuf<char> format_buf;
  basic_ostream<char,_std::char_traits<char>_> output;
  undefined1 auStack_188 [15];
  char local_179;
  undefined **local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  locale local_140 [8];
  basic_buffer<char> *local_138;
  long local_130;
  ios_base local_128 [20];
  undefined4 auStack_114 [61];
  
  local_178 = (undefined **)std::streambuf::overflow;
  local_170 = 0;
  uStack_168 = 0;
  local_160 = 0;
  uStack_158 = 0;
  local_150 = 0;
  uStack_148 = 0;
  std::locale::locale(local_140);
  local_178 = &PTR__streambuf_001b1cf8;
  local_138 = buffer;
  std::ostream::ostream(&local_130,(streambuf *)&local_178);
  lVar1 = *(long *)(local_130 + -0x18);
  *(undefined4 *)((long)auStack_114 + lVar1) = 5;
  std::ios::clear((int)auStack_188 + (int)lVar1 + 0x58);
  poVar3 = (ostream *)std::ostream::operator<<(&local_130,value->year_);
  local_179 = '-';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_179,1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,value->month_);
  local_179 = '-';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_179,1);
  std::ostream::operator<<(poVar3,value->day_);
  uVar2 = buffer->size_;
  if (buffer->capacity_ < uVar2) {
    (**buffer->_vptr_basic_buffer)(buffer,uVar2);
  }
  buffer->size_ = uVar2;
  std::ios_base::~ios_base(local_128);
  local_178 = (undefined **)std::streambuf::overflow;
  std::locale::~locale(local_140);
  return;
}

Assistant:

void format_value(basic_buffer<Char> &buffer, const T &value) {
  internal::formatbuf<Char> format_buf(buffer);
  std::basic_ostream<Char> output(&format_buf);
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  output << value;
  buffer.resize(buffer.size());
}